

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  undefined1 *puVar1;
  secp256k1_strauss_point_state *psVar2;
  int iVar3;
  code *pcVar4;
  secp256k1_scalar *ng;
  secp256k1_scalar *psVar5;
  size_t sVar6;
  secp256k1_gej *r_00;
  ulong uVar7;
  secp256k1_ge *b;
  secp256k1_gej *a;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_callback *error_callback;
  long lVar8;
  secp256k1_sha256 *psVar9;
  secp256k1_sha256 *psVar10;
  size_t size;
  secp256k1_ge r;
  uchar bytes [65];
  secp256k1_gej rj3;
  secp256k1_gej infj;
  secp256k1_gej gj;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  ulong uStack_15f8;
  secp256k1_strauss_state sStack_15e8;
  secp256k1_strauss_point_state sStack_15d0;
  secp256k1_fe asStack_11c0 [8];
  secp256k1_ge asStack_1040 [8];
  secp256k1_gej *psStack_cf8;
  secp256k1_callback *psStack_cf0;
  secp256k1_scratch *psStack_ce8;
  secp256k1_ge *psStack_ce0;
  secp256k1_strauss_point_state *psStack_cd8;
  secp256k1_scalar *psStack_cd0;
  undefined1 local_cb8 [8];
  undefined1 local_cb0 [176];
  secp256k1_gej local_c00;
  secp256k1_gej local_b68;
  secp256k1_gej local_ad0;
  secp256k1_gej local_a38;
  secp256k1_gej local_9a0;
  secp256k1_gej local_908 [2];
  secp256k1_gej local_788 [5];
  secp256k1_strauss_point_state local_448;
  
  local_cb8 = (undefined1  [8])0x41;
  psStack_cd0 = (secp256k1_scalar *)0x14ec12;
  secp256k1_gej_set_ge(&local_ad0,&secp256k1_ge_const_g);
  psStack_cd0 = (secp256k1_scalar *)0x14ec1f;
  secp256k1_gej_set_infinity(&local_b68);
  psStack_cd0 = (secp256k1_scalar *)0x14ec36;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_a38 + 1,x);
  psVar2 = (secp256k1_strauss_point_state *)(local_788[5].y.n + 3);
  psStack_cd0 = (secp256k1_scalar *)0x14ec88;
  local_c00.x.n[0] = (uint64_t)local_908;
  local_c00.x.n[1] = (uint64_t)local_788;
  local_c00.x.n[2] = (uint64_t)psVar2;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&local_c00,&local_a38,1,&local_ad0,x,&secp256k1_scalar_zero)
  ;
  psStack_cd0 = (secp256k1_scalar *)0x14ecb8;
  local_cb0._0_8_ = local_908;
  local_cb0._8_8_ = local_788;
  local_cb0._16_8_ = psVar2;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)local_cb0,&local_c00,1,&local_b68,&secp256k1_scalar_zero,x);
  error_callback = (secp256k1_callback *)0xd0;
  a = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_scalar *)0x0;
  psStack_cd0 = (secp256k1_scalar *)0x14ece9;
  ng = x;
  b = (secp256k1_ge *)scratch;
  iVar3 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)a,scratch,(secp256k1_gej *)(local_788[5].y.n + 3),x,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar3 == 0) {
    psStack_cd0 = (secp256k1_scalar *)0x14ee4c;
    test_ecmult_accumulate_cold_8();
LAB_0014ee4c:
    psStack_cd0 = (secp256k1_scalar *)0x14ee51;
    test_ecmult_accumulate_cold_7();
LAB_0014ee51:
    psStack_cd0 = (secp256k1_scalar *)0x14ee56;
    test_ecmult_accumulate_cold_6();
LAB_0014ee56:
    psStack_cd0 = (secp256k1_scalar *)0x14ee5b;
    test_ecmult_accumulate_cold_5();
LAB_0014ee5b:
    psStack_cd0 = (secp256k1_scalar *)0x14ee60;
    test_ecmult_accumulate_cold_4();
LAB_0014ee60:
    psStack_cd0 = (secp256k1_scalar *)0x14ee65;
    test_ecmult_accumulate_cold_3();
LAB_0014ee65:
    psStack_cd0 = (secp256k1_scalar *)0x14ee6a;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    ng = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_cd0 = (secp256k1_scalar *)0x14ed24;
    b = (secp256k1_ge *)scratch;
    a = (secp256k1_gej *)error_callback;
    cbdata = x;
    iVar3 = secp256k1_ecmult_multi_var
                      (error_callback,scratch,local_788,&secp256k1_scalar_zero,
                       test_ecmult_accumulate_cb,x,1);
    if (iVar3 == 0) goto LAB_0014ee4c;
    psStack_cd0 = (secp256k1_scalar *)0x14ed43;
    secp256k1_ecmult_const(local_908,&secp256k1_ge_const_g,x);
    x = (secp256k1_scalar *)local_cb0;
    psStack_cd0 = (secp256k1_scalar *)0x14ed58;
    secp256k1_ge_set_gej_var((secp256k1_ge *)x,&local_a38 + 1);
    a = &local_a38;
    psStack_cd0 = (secp256k1_scalar *)0x14ed68;
    b = (secp256k1_ge *)x;
    iVar3 = secp256k1_gej_eq_ge_var(a,(secp256k1_ge *)x);
    if (iVar3 == 0) goto LAB_0014ee51;
    a = &local_c00;
    b = (secp256k1_ge *)local_cb0;
    psStack_cd0 = (secp256k1_scalar *)0x14ed82;
    iVar3 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar3 == 0) goto LAB_0014ee56;
    a = (secp256k1_gej *)(local_788[5].y.n + 3);
    b = (secp256k1_ge *)local_cb0;
    psStack_cd0 = (secp256k1_scalar *)0x14ed9c;
    iVar3 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar3 == 0) goto LAB_0014ee5b;
    a = local_788;
    b = (secp256k1_ge *)local_cb0;
    psStack_cd0 = (secp256k1_scalar *)0x14edb6;
    iVar3 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar3 == 0) goto LAB_0014ee60;
    a = local_908;
    b = (secp256k1_ge *)local_cb0;
    psStack_cd0 = (secp256k1_scalar *)0x14edd0;
    iVar3 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar3 == 0) goto LAB_0014ee65;
    psStack_cd0 = (secp256k1_scalar *)0x14ede5;
    secp256k1_ge_verify((secp256k1_ge *)local_cb0);
    if (local_cb0._96_4_ != 0) {
      local_cb0[0x68] = 0;
      sVar6 = 1;
LAB_0014ee2b:
      psStack_cd0 = (secp256k1_scalar *)0x14ee35;
      secp256k1_sha256_write(acc,local_cb0 + 0x68,sVar6);
      return;
    }
    a = (secp256k1_gej *)local_cb0;
    b = (secp256k1_ge *)(local_cb0 + 0x68);
    x = (secp256k1_scalar *)local_cb8;
    ng = (secp256k1_scalar *)0x0;
    psStack_cd0 = (secp256k1_scalar *)0x14ee1a;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)a,(uchar *)b,(size_t *)x,0);
    if (local_cb8 == (undefined1  [8])0x41) {
      sVar6 = 0x41;
      goto LAB_0014ee2b;
    }
  }
  psStack_cd0 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_cd0 = &secp256k1_scalar_zero;
  psStack_cf8 = local_908;
  psStack_cf0 = error_callback;
  psStack_ce8 = scratch;
  psStack_ce0 = (secp256k1_ge *)x;
  psStack_cd8 = psVar2;
  secp256k1_gej_set_infinity(r_00);
  if (ng != (secp256k1_scalar *)0x0 || acc != (secp256k1_sha256 *)0x0) {
    if (acc != (secp256k1_sha256 *)0x0) {
      if (b != (secp256k1_ge *)0x0) {
        sVar6 = secp256k1_pippenger_max_points((secp256k1_callback *)a,(secp256k1_scratch *)b);
        psVar9 = acc;
        if (sVar6 != 0) {
          uVar7 = 5000000;
          if (sVar6 < 5000000) {
            uVar7 = sVar6;
          }
          puVar1 = (undefined1 *)((long)&acc[-1].bytes + 7);
          uStack_15f8 = (ulong)puVar1 / uVar7 + 1;
          psVar9 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_15f8 + 1);
        }
        if (sVar6 != 0) {
          if (psVar9 < (secp256k1_sha256 *)0x58) {
            sVar6 = secp256k1_scratch_max_allocation
                              ((secp256k1_callback *)a,(secp256k1_scratch *)b,5);
            if (0x987 < sVar6) {
              uVar7 = sVar6 / 0x988;
              if (4999999 < uVar7) {
                uVar7 = 5000000;
              }
              puVar1 = (undefined1 *)((long)&acc[-1].bytes + 7);
              uStack_15f8 = (ulong)puVar1 / uVar7 + 1;
              psVar9 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_15f8 + 1);
            }
            if (sVar6 < 0x988) goto LAB_0014f00a;
            pcVar4 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar4 = secp256k1_ecmult_pippenger_batch;
          }
          lVar8 = 0;
          uVar7 = 0;
          while( true ) {
            psVar10 = psVar9;
            if (acc < psVar9) {
              psVar10 = acc;
            }
            psVar5 = (secp256k1_scalar *)0x0;
            if (uVar7 == 0) {
              psVar5 = ng;
            }
            iVar3 = (*pcVar4)(a,b,&sStack_15d0,psVar5,cb,cbdata,psVar10,lVar8);
            if (iVar3 == 0) break;
            secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_15d0,(secp256k1_fe *)0x0);
            acc = (secp256k1_sha256 *)((long)acc - (long)psVar10);
            uVar7 = uVar7 + 1;
            lVar8 = (long)psVar9->s + lVar8;
            if (uStack_15f8 == uVar7) {
              return;
            }
          }
          return;
        }
      }
LAB_0014f00a:
      secp256k1_ecmult_multi_simple_var(r_00,ng,cb,cbdata,(size_t)acc);
      return;
    }
    sStack_15e8.aux = asStack_11c0;
    sStack_15e8.pre_a = asStack_1040;
    sStack_15e8.ps = &sStack_15d0;
    secp256k1_ecmult_strauss_wnaf(&sStack_15e8,r_00,1,r_00,&secp256k1_scalar_zero,ng);
  }
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &secp256k1_scalar_zero);
    secp256k1_ecmult(&rj3, &infj, &secp256k1_scalar_zero, x);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj4, x, NULL, NULL, 0));
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &rj5, &secp256k1_scalar_zero, test_ecmult_accumulate_cb, (void*)x, 1));
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    CHECK(secp256k1_gej_eq_ge_var(&rj2, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj3, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj4, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj5, &r));
    CHECK(secp256k1_gej_eq_ge_var(&rj6, &r));
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}